

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

void __thiscall ghc::filesystem::directory_iterator::impl::increment(impl *this,error_code *ec)

{
  int iVar1;
  int *piVar2;
  dirent *pdVar3;
  error_category *peVar4;
  char *__s1;
  
  if (this->_dir != (DIR *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    pdVar3 = readdir((DIR *)this->_dir);
    this->_entry = (dirent *)pdVar3;
    if (pdVar3 != (dirent *)0x0) {
      do {
        std::__cxx11::string::_M_assign((string *)&this->_dir_entry);
        filesystem::path::append_name(&(this->_dir_entry)._path,this->_entry->d_name);
        copyToDirEntry(this);
        if (((ec->_M_value == 0xd) || (ec->_M_value == 1)) &&
           ((this->_options & skip_permission_denied) != none)) {
          peVar4 = (error_category *)std::_V2::system_category();
          ec->_M_value = 0;
          ec->_M_cat = peVar4;
        }
        else {
          __s1 = this->_entry->d_name;
          iVar1 = strcmp(__s1,".");
          if ((iVar1 != 0) && (iVar1 = strcmp(__s1,".."), iVar1 != 0)) {
            return;
          }
        }
        *piVar2 = 0;
        pdVar3 = readdir((DIR *)this->_dir);
        this->_entry = (dirent *)pdVar3;
      } while (pdVar3 != (dirent *)0x0);
    }
    closedir((DIR *)this->_dir);
    this->_dir = (DIR *)0x0;
    (this->_dir_entry)._path._path._M_string_length = 0;
    *(this->_dir_entry)._path._path._M_dataplus._M_p = '\0';
    iVar1 = *piVar2;
    if (iVar1 != 0) {
      peVar4 = (error_category *)std::_V2::system_category();
      ec->_M_value = iVar1;
      ec->_M_cat = peVar4;
    }
  }
  return;
}

Assistant:

void increment(std::error_code& ec)
    {
        if (_dir) {
            bool skip;
            do {
                skip = false;
                errno = 0;
                _entry = ::readdir(_dir);
                if (_entry) {
                    _dir_entry._path = _base;
                    _dir_entry._path.append_name(_entry->d_name);
                    copyToDirEntry();
                    if (ec && (ec.value() == EACCES || ec.value() == EPERM) && (_options & directory_options::skip_permission_denied) == directory_options::skip_permission_denied) {
                        ec.clear();
                        skip = true;
                    }
                }
                else {
                    ::closedir(_dir);
                    _dir = nullptr;
                    _dir_entry._path.clear();
                    if (errno) {
                        ec = detail::make_system_error();
                    }
                    break;
                }
            } while (skip || std::strcmp(_entry->d_name, ".") == 0 || std::strcmp(_entry->d_name, "..") == 0);
        }
    }